

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS
ref_mpi_balance(REF_MPI ref_mpi,REF_INT ldim,REF_INT nitem,void *items,REF_INT first_rank,
               REF_INT last_rank,REF_INT *nbalanced,void **balanced,REF_TYPE type)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  REF_INT *pRVar6;
  uint *__ptr;
  undefined4 extraout_var;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  REF_STATUS RVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  size_t __size;
  int iVar15;
  uint uVar16;
  REF_INT total;
  ulong local_58;
  REF_INT *local_50;
  void *local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  total = nitem;
  uVar3 = ref_mpi_allsum(ref_mpi,&total,1,1);
  if (uVar3 == 0) {
    uVar3 = (last_rank - first_rank) + 1;
    iVar15 = ref_mpi->id;
    iVar4 = 0;
    local_38 = 0;
    if (iVar15 <= last_rank && first_rank <= iVar15) {
      iVar4 = total / (int)uVar3;
      local_38 = (long)total % (long)(int)uVar3 & 0xffffffff;
    }
    iVar9 = 0;
    if (0 < iVar15 - first_rank) {
      iVar9 = iVar15 - first_rank;
    }
    uVar16 = (uint)(iVar9 < (int)local_38) + iVar4;
    *nbalanced = uVar16;
    local_48 = items;
    local_40 = first_rank;
    local_3c = last_rank;
    if ((long)ref_mpi->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4b8,
             "ref_mpi_balance","malloc haves of REF_INT negative");
      uVar3 = 1;
    }
    else {
      __size = (long)ref_mpi->n << 2;
      pRVar6 = (REF_INT *)malloc(__size);
      if (pRVar6 == (REF_INT *)0x0) {
        pcVar13 = "malloc haves of REF_INT NULL";
        uVar7 = 0x4b8;
      }
      else {
        local_50 = pRVar6;
        __ptr = (uint *)malloc(__size);
        if (__ptr != (uint *)0x0) {
          *__ptr = uVar16;
          *local_50 = nitem;
          if (nitem < 0) {
            bVar2 = false;
            iVar15 = printf("%s: %d: %s: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                            ,0x4bd,"ref_mpi_balance","malloc destination of REF_INT negative");
            pRVar6 = (REF_INT *)CONCAT44(extraout_var,iVar15);
            RVar11 = 1;
          }
          else {
            pRVar6 = (REF_INT *)malloc((ulong)(uint)nitem * 4);
            if (pRVar6 == (REF_INT *)0x0) {
              bVar2 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c"
                     ,0x4bd,"ref_mpi_balance","malloc destination of REF_INT NULL");
              RVar11 = 2;
              pRVar6 = (REF_INT *)0x0;
            }
            else {
              if (nitem != 0) {
                memset(pRVar6,0,(ulong)(uint)nitem << 2);
              }
              bVar2 = true;
              RVar11 = 0;
            }
          }
          if (!bVar2) {
            return RVar11;
          }
          iVar15 = 0;
          if (0 < (long)ref_mpi->id) {
            lVar8 = 0;
            do {
              iVar15 = iVar15 + local_50[lVar8];
              lVar8 = lVar8 + 1;
            } while (ref_mpi->id != lVar8);
          }
          if (0 < nitem) {
            uVar5 = ref_mpi->n;
            uVar10 = 0;
            do {
              uVar12 = uVar5 - 1;
              if (0 < (int)uVar5) {
                uVar14 = 0;
                iVar4 = (int)uVar10 + iVar15;
                do {
                  puVar1 = __ptr + uVar14;
                  if (iVar4 < (int)*puVar1) goto LAB_00220b06;
                  uVar14 = uVar14 + 1;
                  iVar4 = iVar4 - *puVar1;
                } while (uVar5 != uVar14);
                uVar14 = (ulong)(uVar5 - 1);
LAB_00220b06:
                uVar12 = (uint)uVar14;
              }
              pRVar6[uVar10] = uVar12;
              uVar10 = uVar10 + 1;
            } while (uVar10 != (uint)nitem);
          }
          local_58 = (ulong)(uint)nitem;
          uVar5 = ref_mpi_blindsend(ref_mpi,pRVar6,local_48,ldim,nitem,balanced,nbalanced,type);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x4c8,"ref_mpi_balance",(ulong)uVar5,"blind send node");
            return uVar5;
          }
          uVar5 = *nbalanced;
          if (uVar16 != uVar5) {
            local_48 = (void *)(long)(int)uVar5;
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                   0x4d1,"ref_mpi_balance","share mismatch",(long)(int)uVar16,
                   (void *)(long)(int)uVar5);
            printf("rank %d first %d last %d active %d total %d rem %d share %d nitem %d\n",
                   (ulong)(uint)ref_mpi->id,(ulong)local_40,(ulong)local_3c,(ulong)uVar3,
                   (ulong)(uint)total,local_38,(ulong)uVar16,local_58);
            if (0 < ref_mpi->n) {
              lVar8 = 0;
              do {
                printf(" %d",(ulong)__ptr[lVar8]);
                lVar8 = lVar8 + 1;
              } while (lVar8 < ref_mpi->n);
            }
            putchar(10);
            RVar11 = 1;
            uVar5 = (uint)local_48;
          }
          if (uVar16 != uVar5) {
            return RVar11;
          }
          if (pRVar6 != (REF_INT *)0x0) {
            free(pRVar6);
          }
          free(__ptr);
          free(local_50);
          return 0;
        }
        pcVar13 = "malloc shares of REF_INT NULL";
        uVar7 = 0x4b9;
      }
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
             "ref_mpi_balance",pcVar13);
      uVar3 = 2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x4aa,
           "ref_mpi_balance",(ulong)uVar3,"total items");
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_balance(REF_MPI ref_mpi, REF_INT ldim, REF_INT nitem,
                                   void *items, REF_INT first_rank,
                                   REF_INT last_rank, REF_INT *nbalanced,
                                   void **balanced, REF_TYPE type) {
  REF_INT *shares, total, share, remainder;
  REF_INT *haves;
  REF_INT *destination, offset, part, i;
  REF_INT active;

  active = last_rank - first_rank + 1;

  total = nitem;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_INT_TYPE), "total items");
  if (first_rank <= ref_mpi_rank(ref_mpi) &&
      ref_mpi_rank(ref_mpi) <= last_rank) {
    share = total / active;
    remainder = total - share * active;
  } else {
    share = 0;
    remainder = 0;
  }
  if (MAX(0, ref_mpi_rank(ref_mpi) - first_rank) < remainder) {
    share++;
  }
  *nbalanced = share;

  ref_malloc(haves, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(shares, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &share, shares, REF_INT_TYPE), "all share");
  RSS(ref_mpi_allgather(ref_mpi, &nitem, haves, REF_INT_TYPE), "all share");

  ref_malloc_init(destination, nitem, REF_INT, 0);
  offset = 0;
  for (part = 0; part < ref_mpi_rank(ref_mpi); part++) {
    offset += haves[part];
  }
  for (i = 0; i < nitem; i++) {
    destination[i] = find_destination(ref_mpi_n(ref_mpi), shares, offset + i);
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, items, ldim, nitem, balanced,
                        nbalanced, type),
      "blind send node");
  REIB(share, *nbalanced, "share mismatch", {
    printf(
        "rank %d first %d last %d active %d total %d rem %d share %d nitem "
        "%d\n",
        ref_mpi_rank(ref_mpi), first_rank, last_rank, active, total, remainder,
        share, nitem);
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) printf(" %d", shares[i]);
    printf("\n");
  });

  ref_free(destination);
  ref_free(shares);
  ref_free(haves);

  return REF_SUCCESS;
}